

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

void __thiscall QDirPrivate::initFileLists(QDirPrivate *this,QDir *dir)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_90;
  QArrayDataPointer<char16_t> local_78;
  QDirListing local_60;
  QArrayDataPointer<QFileInfo> local_58;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._0_8_ = &this->fileCache;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_38._0_8_);
  local_38[8] = true;
  if (((this->fileCache).fileListsInitialized._M_base._M_i & 1U) == 0) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (QFileInfo *)0x0;
    local_58.size = 0;
    QDir::path((QString *)&local_78,dir);
    QDir::nameFilters((QStringList *)&local_90,dir);
    QDirListing::QDirListing
              (&local_60,(QString *)&local_78,(QStringList *)&local_90,
               (((dir->d_ptr).d.ptr)->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.
               super_QFlagsStorage<QDir::Filter>.i,0);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    local_78.d = (Data *)QDirListing::begin(&local_60);
    for (; (QDirListingPrivate *)local_78.d != (QDirListingPrivate *)0x0;
        local_78.d = (Data *)QDirListing::next((DirEntry)local_78.d)) {
      QDirListing::DirEntry::fileInfo((DirEntry *)&local_90);
      QList<QFileInfo>::emplaceBack<QFileInfo>((QList<QFileInfo> *)&local_58,(QFileInfo *)&local_90)
      ;
      QFileInfo::~QFileInfo((QFileInfo *)&local_90);
    }
    QDirListing::~QDirListing(&local_60);
    sortFileList((SortFlags)
                 (this->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
                 super_QFlagsStorage<QDir::SortFlag>.i,(QFileInfoList *)&local_58,
                 &(this->fileCache).files,&(this->fileCache).fileInfos);
    LOCK();
    (this->fileCache).fileListsInitialized._M_base._M_i = true;
    UNLOCK();
    QArrayDataPointer<QFileInfo>::~QArrayDataPointer(&local_58);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QDirPrivate::initFileLists(const QDir &dir) const
{
    QMutexLocker locker(&fileCache.mutex);
    if (!fileCache.fileListsInitialized) {
        QFileInfoList l;
        for (const auto &dirEntry : QDirListing(dir.path(), dir.nameFilters(),
                                                dir.filter().toInt())) {
            l.emplace_back(dirEntry.fileInfo());
        }

        sortFileList(sort, l, &fileCache.files, &fileCache.fileInfos);
        fileCache.fileListsInitialized = true;
    }
}